

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O0

bool Search::array_contains<unsigned_int>(uint target,uint *A,size_t n)

{
  size_t i;
  size_t n_local;
  uint *A_local;
  uint target_local;
  
  if (A != (uint *)0x0) {
    for (i = 0; i < n; i = i + 1) {
      if (A[i] == target) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool array_contains(T target, const T* A, size_t n)
{
  if (A == nullptr)
    return false;
  for (size_t i = 0; i < n; i++)
    if (A[i] == target)
      return true;
  return false;
}